

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open.c
# Opt level: O2

FILE * open_file_std(char *fname,char *mode)

{
  FILE *pFVar1;
  undefined8 *puVar2;
  
  if ((*fname == '-') && (fname[1] == '\0')) {
    if (*mode == 'w') {
      puVar2 = (undefined8 *)&stdout;
    }
    else {
      if (*mode != 'r') {
        fprintf(_stderr,"Bad mode passed to open_file_std: %s\n");
        exit(1);
      }
      puVar2 = (undefined8 *)&stdin;
    }
    return (FILE *)*puVar2;
  }
  pFVar1 = fopen(fname,mode);
  return (FILE *)pFVar1;
}

Assistant:

FILE *open_file_std
( char *fname,	/* Name of file to open, or "-" for stdin/stdout */
  char *mode	/* Mode for opening: eg, "r" or "w" */
)
{ 
  if (strcmp(fname,"-")==0)
  { switch (mode[0])
    { case 'r': 
      { return stdin;
      }
      case 'w': 
      { return stdout;
      }
      default:  
      { fprintf(stderr,"Bad mode passed to open_file_std: %s\n",mode);
        exit(1);
      }
    }
  }
  else
  { return fopen(fname,mode);
  }
}